

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void __thiscall WriteUint128_Basic_Test::TestBody(WriteUint128_Basic_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_48;
  v128 local_28;
  
  local_28.v = (uint8_t  [16])ZEXT816(0);
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"0","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_28.v._0_12_ = ZEXT812(1);
  local_28.v[0xc] = '\0';
  local_28.v[0xd] = '\0';
  local_28.v[0xe] = '\0';
  local_28.v[0xf] = '\0';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"1","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  builtin_memcpy(local_28.v,"\r\x0e\x0f\x10\t\n\v\f\x05\x06\a\b\x01\x02\x03\x04",0x10);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"5332529520247008778714484145835150861","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_28.v[8] = 0xbb;
  local_28.v[9] = 0xaa;
  local_28.v[10] = 0x99;
  local_28.v[0xb] = 0x88;
  local_28.v[0xc] = 0xff;
  local_28.v[0xd] = 0xee;
  local_28.v[0xe] = 0xdd;
  local_28.v[0xf] = 0xcc;
  builtin_memcpy(local_28.v,"3\"\x11",4);
  local_28.v[4] = 'w';
  local_28.v[5] = 'f';
  local_28.v[6] = 'U';
  local_28.v[7] = 'D';
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"272314856204801878456120017448021860915","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_28.v[8] = 0xff;
  local_28.v[9] = 0xff;
  local_28.v[10] = 0xff;
  local_28.v[0xb] = 0xff;
  local_28.v[0] = 0xff;
  local_28.v[1] = 0xff;
  local_28.v[2] = 0xff;
  local_28.v[3] = 0xff;
  local_28.v[4] = 0xff;
  local_28.v[5] = 0xff;
  local_28.v[6] = 0xff;
  local_28.v[7] = 0xff;
  local_28.v[0xc] = 0xff;
  local_28.v[0xd] = 0xff;
  local_28.v[0xe] = 0xff;
  local_28.v[0xf] = 0xff;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"340282366920938463463374607431768211455","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  local_28.v = (uint8_t  [16])(ZEXT816(1) << 0x40);
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"18446744073709551616","");
  AssertWriteUint128Equals(&local_28,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AssertInt64Equals(uint64_t expected,
                       const char* s,
                       ParseIntTypeCombo parse_type = Both) {
  AssertIntEquals(expected, s, ParseInt64, parse_type);
}